

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O0

string * __thiscall
cpptrace::microfmt::format<char_const*const&,std::__cxx11::string_const&,char_const*const&>
          (string *__return_storage_ptr__,microfmt *this,char *fmt,char **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,char **args_2)

{
  array<cpptrace::microfmt::detail::format_value,_3UL> args_00;
  size_t sVar1;
  anon_union_16_6_5e21074f_for_format_value_0 local_78;
  undefined8 local_68;
  anon_union_16_6_5e21074f_for_format_value_0 aStack_60;
  undefined8 uStack_50;
  anon_union_16_6_5e21074f_for_format_value_0 local_48;
  char *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  char **args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char **args_local;
  char *fmt_local;
  
  local_30 = args_1;
  args_local_2 = args;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt;
  args_local = (char **)this;
  fmt_local = (char *)__return_storage_ptr__;
  sVar1 = strlen((char *)this);
  detail::format_value::format_value
            ((format_value *)&local_78.string_view_value,(args_local_1->_M_dataplus)._M_p);
  detail::format_value::format_value
            ((format_value *)&aStack_60.string_view_value,(string *)args_local_2);
  detail::format_value::format_value
            ((format_value *)&local_48.string_view_value,(local_30->_M_dataplus)._M_p);
  args_00._M_elems[0].field_0.string_view_value._M_str = local_78.string_view_value._M_str;
  args_00._M_elems[0].field_0.int64_value = local_78.int64_value;
  args_00._M_elems[0]._16_8_ = local_68;
  args_00._M_elems[1].field_0.int64_value = aStack_60.int64_value;
  args_00._M_elems[1].field_0.string_view_value._M_str = aStack_60.string_view_value._M_str;
  args_00._M_elems[1]._16_8_ = uStack_50;
  args_00._M_elems[2].field_0.int64_value = local_48.int64_value;
  args_00._M_elems[2].field_0.string_view_value._M_str = local_48.string_view_value._M_str;
  args_00._M_elems[2]._16_8_ = local_38;
  detail::format<3ul,char_const*>
            (__return_storage_ptr__,(detail *)this,(char *)(this + sVar1),local_38,args_00);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, Args&&... args) {
        return detail::format<sizeof...(args)>(fmt, fmt + std::strlen(fmt), {detail::format_value(args)...});
    }